

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderLibrary.cpp
# Opt level: O3

ValueBufferLayout *
vkt::anon_unknown_0::computeStd140Layout
          (ValueBufferLayout *__return_storage_ptr__,
          vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *values)

{
  int iVar1;
  int iVar2;
  DataType dataType;
  int iVar3;
  pointer pVVar4;
  long lVar5;
  uint uVar6;
  Entry EVar7;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->entries).
           super__Vector_base<vkt::(anonymous_namespace)::ValueBufferLayout::Entry,_std::allocator<vkt::(anonymous_namespace)::ValueBufferLayout::Entry>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->entries).
           super__Vector_base<vkt::(anonymous_namespace)::ValueBufferLayout::Entry,_std::allocator<vkt::(anonymous_namespace)::ValueBufferLayout::Entry>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (__return_storage_ptr__->entries).
  super__Vector_base<vkt::(anonymous_namespace)::ValueBufferLayout::Entry,_std::allocator<vkt::(anonymous_namespace)::ValueBufferLayout::Entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->entries).
  super__Vector_base<vkt::(anonymous_namespace)::ValueBufferLayout::Entry,_std::allocator<vkt::(anonymous_namespace)::ValueBufferLayout::Entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<vkt::(anonymous_namespace)::ValueBufferLayout::Entry,_std::allocator<vkt::(anonymous_namespace)::ValueBufferLayout::Entry>_>
  ::resize(&__return_storage_ptr__->entries,
           ((long)(values->super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(values->super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>).
                  _M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333);
  pVVar4 = (values->super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((values->super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>)._M_impl.
      super__Vector_impl_data._M_finish != pVVar4) {
    lVar5 = 1;
    uVar8 = 0;
    do {
      dataType = *(DataType *)
                  (&(((_Vector_base<vkt::(anonymous_namespace)::ValueBufferLayout::Entry,_std::allocator<vkt::(anonymous_namespace)::ValueBufferLayout::Entry>_>
                       *)&(pVVar4->type).m_type)->_M_impl).super__Vector_impl_data._M_start + lVar5)
      ;
      bVar9 = dataType - TYPE_FLOAT_MAT2 < 9;
      bVar10 = dataType - TYPE_DOUBLE_MAT2 < 9;
      iVar1 = 1;
      if (bVar10 || bVar9) {
        iVar1 = glu::getDataTypeMatrixNumColumns(dataType);
        iVar2 = glu::getDataTypeMatrixNumRows(dataType);
        dataType = glu::getDataTypeFloatVec(iVar2);
      }
      iVar3 = glu::getDataTypeScalarSize(dataType);
      iVar2 = 0x10;
      if (iVar3 != 3) {
        iVar2 = iVar3 * 4;
      }
      if (bVar10 || bVar9) {
        iVar2 = 0x10;
      }
      uVar6 = -iVar2 & (__return_storage_ptr__->size + iVar2) - 1U;
      EVar7.vecStride = iVar2;
      EVar7.offset = uVar6;
      (__return_storage_ptr__->entries).
      super__Vector_base<vkt::(anonymous_namespace)::ValueBufferLayout::Entry,_std::allocator<vkt::(anonymous_namespace)::ValueBufferLayout::Entry>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar8] = EVar7;
      __return_storage_ptr__->size = (iVar1 + -1) * iVar2 + iVar3 * 4 + uVar6;
      uVar8 = uVar8 + 1;
      pVVar4 = (values->super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>)._M_impl
               .super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 10;
    } while (uVar8 < (ulong)(((long)(values->
                                    super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar4 >> 4)
                            * -0x3333333333333333));
  }
  return (ValueBufferLayout *)pVVar4;
}

Assistant:

ValueBufferLayout computeStd140Layout (const vector<Value>& values)
{
	ValueBufferLayout layout;

	layout.entries.resize(values.size());

	for (size_t ndx = 0; ndx < values.size(); ++ndx)
	{
		const DataType	basicType	= values[ndx].type.getBasicType();
		const bool		isMatrix	= isDataTypeMatrix(basicType);
		const int		numVecs		= isMatrix ? getDataTypeMatrixNumColumns(basicType) : 1;
		const DataType	vecType		= isMatrix ? glu::getDataTypeFloatVec(getDataTypeMatrixNumRows(basicType)) : basicType;
		const int		vecSize		= getDataTypeScalarSize(vecType);
		const int		alignment	= ((isMatrix || vecSize == 3) ? 4 : vecSize)*int(sizeof(deUint32));

		layout.size			= deAlign32(layout.size, alignment);
		layout.entries[ndx] = ValueBufferLayout::Entry(layout.size, alignment);
		layout.size			+= alignment*(numVecs-1) + vecSize*int(sizeof(deUint32));
	}

	return layout;
}